

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void __thiscall Board::Board(Board *this,int color,GameBoard *gameBoard)

{
  long in_RDX;
  int in_ESI;
  Board *in_RDI;
  int j;
  int i;
  int local_20;
  int local_1c;
  
  setFrame(in_RDI);
  for (local_1c = 1; local_1c < 0x15; local_1c = local_1c + 1) {
    for (local_20 = 1; local_20 < 0xb; local_20 = local_20 + 1) {
      if (*(int *)(in_RDX + 0x14 + (long)in_ESI * 0x420 + (long)local_1c * 0x30 + (long)local_20 * 4
                  ) != 0) {
        in_RDI->rows[local_1c] = 1 << ((byte)local_20 & 0x1f) | in_RDI->rows[local_1c];
        in_RDI->cols[local_20] = 1 << ((byte)local_1c & 0x1f) | in_RDI->cols[local_20];
      }
    }
  }
  return;
}

Assistant:

Board::Board(int color, const GameBoard &gameBoard){
    setFrame();
    for (int i = 1; i <= MAPHEIGHT; ++i)
        for (int j = 1; j <= MAPWIDTH; ++j)
            if (gameBoard.gridInfo[color][i][j]){
                rows[i] |= 1 << j;
                cols[j] |= 1 << i;
            }
}